

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

bool __thiscall
Lib::DHMap<SAT::SATLiteral,_Kernel::Literal_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
          (DHMap<SAT::SATLiteral,_Kernel::Literal_*,_Lib::DefaultHash,_Lib::DefaultHash2> *this,
          SATLiteral key,Literal *val)

{
  uint uVar1;
  bool bVar2;
  Entry *pEVar3;
  uint uVar4;
  uint uVar5;
  anon_union_4_2_6ac8864f_for_SATLiteral_0 local_1c;
  
  local_1c = key.field_0;
  ensureExpanded(this);
  pEVar3 = findEntryToInsert(this,(SATLiteral *)&local_1c.field_1);
  uVar5 = (uint)(pEVar3->field_0)._infoData >> 2;
  uVar1 = this->_timestamp;
  bVar2 = ((pEVar3->field_0)._infoData & 1U) != 0;
  if (bVar2 || uVar5 != uVar1) {
    if (uVar5 == uVar1) {
      this->_deleted = this->_deleted + -1;
      uVar4 = (pEVar3->field_0)._infoData & 0xfffffffe;
    }
    else {
      uVar4 = uVar1 << 2;
    }
    (pEVar3->field_0)._infoData = uVar4;
    (pEVar3->_key).field_0.field_1 =
         (anon_struct_4_2_b3f3f878_for_anon_union_4_2_6ac8864f_for_SATLiteral_0_1)local_1c;
    pEVar3->_val = val;
    this->_size = this->_size + 1;
  }
  return bVar2 || uVar5 != uVar1;
}

Assistant:

bool insert(Key key, Val val)
  {
    ensureExpanded();
    Entry* e=findEntryToInsert(key);
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key = std::move(key);
      e->_val = std::move(val);
      _size++;
    }
    return !exists;

  }